

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
DetectorExample_LUX_RUN03::FitTBA
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,double zPos_mm)

{
  reference pvVar1;
  double TBArS2;
  double TBAzS1;
  double radSq;
  allocator<double> local_32;
  undefined1 local_31;
  double local_30;
  double zPos_mm_local;
  double yPos_mm_local;
  double xPos_mm_local;
  DetectorExample_LUX_RUN03 *this_local;
  vector<double,_std::allocator<double>_> *BotTotRat;
  
  local_31 = 0;
  local_30 = zPos_mm;
  zPos_mm_local = yPos_mm;
  yPos_mm_local = xPos_mm;
  xPos_mm_local = (double)this;
  this_local = (DetectorExample_LUX_RUN03 *)__return_storage_ptr__;
  std::allocator<double>::allocator(&local_32);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,2,&local_32);
  std::allocator<double>::~allocator(&local_32);
  pow(yPos_mm_local,2.0);
  pow(zPos_mm_local,2.0);
  TBArS2 = (local_30 / 10.0) * 0.00925 + -0.853;
  if (TBArS2 < -1.0) {
    TBArS2 = -1.0;
  }
  if (1.0 < TBArS2) {
    TBArS2 = 1.0;
  }
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar1 = (1.0 - TBArS2) / 2.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,1);
  *pvVar1 = 0.449;
  return __return_storage_ptr__;
}

Assistant:

vector<double> FitTBA(double xPos_mm, double yPos_mm,
                        double zPos_mm) override {
    vector<double> BotTotRat(2);

    double radSq = (pow(xPos_mm, 2.) + pow(yPos_mm, 2.)) / 1e2;
    double TBAzS1 = -0.853 + 0.00925 * (zPos_mm / 10.);
    double TBArS2 = 0.126 + 0.000545 * radSq - 1.90e-6 * radSq * radSq +
                    1.20e-9 * radSq * radSq * radSq;

    if (TBAzS1 < -1.) TBAzS1 = -1.;
    if (TBAzS1 > 1.0) TBAzS1 = 1.0;
    if (TBArS2 < -1.) TBArS2 = -1.;
    if (TBArS2 > 1.0) TBArS2 = 1.0;

    BotTotRat[0] = (1. - TBAzS1) / 2.;  // 1712.05696
    BotTotRat[1] = 0.449;  //(1.-TBArS2)/2.;  // 1712.05696 and 1710.02752
                           // position recon (1-this)

    return BotTotRat;
  }